

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O3

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>
::
value_init<absl::container_internal::slot_type<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>>*>
          (btree_node<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>
           *this,size_type i,allocator_type *alloc,
          slot_type<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_> **args)

{
  slot_type<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_> *psVar1;
  pointer ppSVar2;
  long lVar3;
  
  if (((ulong)this & 7) == 0) {
    lVar3 = (long)(int)i * 0x20;
    psVar1 = *args;
    ppSVar2 = (psVar1->value).second.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    *(S2Shape **)(this + lVar3 + 0x10) = (psVar1->value).first;
    *(pointer *)(this + lVar3 + 0x10 + 8) = ppSVar2;
    ppSVar2 = (psVar1->value).second.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    *(pointer *)(this + lVar3 + 0x20) =
         (psVar1->value).second.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    *(pointer *)(this + lVar3 + 0x20 + 8) = ppSVar2;
    (psVar1->value).second.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (psVar1->value).second.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (psVar1->value).second.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Shape *, std::vector<S2Shape *>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Shape *, std::vector<S2Shape *>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
               );
}

Assistant:

CopyConst<Char, ElementType<N>>* Pointer(Char* p) const {
    using C = typename std::remove_const<Char>::type;
    static_assert(
        std::is_same<C, char>() || std::is_same<C, unsigned char>() ||
            std::is_same<C, signed char>(),
        "The argument must be a pointer to [const] [signed|unsigned] char");
    // Use a named variable to work around b/33479323.
    constexpr size_t alignment = Alignment();
    (void)alignment;
    assert(reinterpret_cast<uintptr_t>(p) % alignment == 0);
    return reinterpret_cast<CopyConst<Char, ElementType<N>>*>(p + Offset<N>());
  }